

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O1

Iterator __thiscall HashMap<String,_String>::find(HashMap<String,_String> *this,String *key)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  Item *this_00;
  
  if (this->data != (Item **)0x0) {
    uVar1 = key->data->len;
    pcVar3 = String::operator_cast_to_char_(key);
    for (this_00 = this->data
                   [((long)pcVar3[(ulong)(uVar1 == 0) + (uVar1 - 1)] ^
                    ((long)pcVar3[uVar1 >> 1] ^ ((long)*pcVar3 ^ uVar1 * 0x41a7) * 0x41a7) * 0x41a7)
                    % this->capacity]; this_00 != (Item *)0x0; this_00 = this_00->nextCell) {
      bVar2 = String::operator==(&this_00->key,key);
      if (bVar2) {
        return (Iterator)this_00;
      }
    }
  }
  return (Iterator)(this->_end).item;
}

Assistant:

Iterator find(const T& key) const
  {
    if(!data) return _end;
    usize hashCode = hash(key);
    Item* item = data[hashCode % capacity];
    while(item)
    {
      if(item->key == key) return item;
      item = item->nextCell;
    }
    return _end;
  }